

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.h
# Opt level: O0

bool xemmai::t_type_of<long>::t_cast<int>::f_is(t_object *a_object)

{
  bool bVar1;
  t_type *this;
  t_object *a_object_local;
  
  if ((t_object *)0x2 < a_object) {
    if (a_object == (t_object *)0x3) {
      return true;
    }
    if (a_object != (t_object *)0x4) {
      this = t_object::f_type(a_object);
      bVar1 = t_type_of<xemmai::t_object>::f_derives<long>(this);
      return bVar1;
    }
  }
  return false;
}

Assistant:

static bool f_is(t_object* a_object)
		{
			if (!std::is_same_v<typename t_fundamental<T>::t_type, intptr_t>) return reinterpret_cast<uintptr_t>(a_object) >= c_tag__OBJECT && a_object->f_type()->f_derives<typename t_fundamental<T>::t_type>();
			switch (reinterpret_cast<uintptr_t>(a_object)) {
			case c_tag__INTEGER:
				return true;
			case c_tag__NULL:
			case c_tag__FALSE:
			case c_tag__TRUE:
			case c_tag__FLOAT:
				return false;
			default:
				return a_object->f_type()->f_derives<intptr_t>();
			}
		}